

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O1

void Map_MappingSetPiArrivalTimes(Map_Man_t *p)

{
  Map_Node_t *pMVar1;
  Map_Time_t *pMVar2;
  undefined8 uVar3;
  float *pfVar4;
  Map_SuperLib_t *pMVar5;
  Scl_Con_t *pSVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (0 < p->nInputs) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pMVar1 = p->pInputs[lVar8];
      pSVar6 = Scl_ConReadMan();
      if (pSVar6 == (Scl_Con_t *)0x0) {
        pMVar2 = p->pInputArrivals;
        pMVar1->tArrival[1].Worst = *(float *)((long)&pMVar2->Worst + lVar7);
        uVar3 = *(undefined8 *)((long)&pMVar2->Rise + lVar7);
        pMVar1->tArrival[1].Rise = (float)(int)uVar3;
        pMVar1->tArrival[1].Fall = (float)(int)((ulong)uVar3 >> 0x20);
      }
      else {
        pSVar6 = Scl_ConReadMan();
        if ((pSVar6->vInArrs).nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        fVar9 = (float)(pSVar6->vInArrs).pArray[lVar8] / 1000.0;
        pMVar1->tArrival[1].Fall = fVar9;
        pMVar1->tArrival[1].Rise = fVar9;
        pMVar1->tArrival[1].Worst = fVar9;
      }
      pfVar4 = p->pNodeDelays;
      fVar10 = 0.0;
      fVar9 = 0.0;
      if (pfVar4 != (float *)0x0) {
        fVar9 = pfVar4[pMVar1->Num];
      }
      fVar9 = fVar9 + pMVar1->tArrival[1].Rise;
      pMVar1->tArrival[1].Rise = fVar9;
      if (pfVar4 != (float *)0x0) {
        fVar10 = pfVar4[pMVar1->Num];
      }
      fVar10 = fVar10 + pMVar1->tArrival[1].Fall;
      pMVar1->tArrival[1].Fall = fVar10;
      if (pfVar4 == (float *)0x0) {
        fVar11 = 0.0;
      }
      else {
        fVar11 = pfVar4[pMVar1->Num];
      }
      pMVar1->tArrival[1].Worst = fVar11 + pMVar1->tArrival[1].Worst;
      pMVar5 = p->pSuperLib;
      fVar10 = fVar10 + (pMVar5->tDelayInv).Rise;
      pMVar1->tArrival[0].Rise = fVar10;
      fVar9 = fVar9 + (pMVar5->tDelayInv).Fall;
      pMVar1->tArrival[0].Fall = fVar9;
      if (fVar10 <= fVar9) {
        fVar10 = fVar9;
      }
      pMVar1->tArrival[0].Worst = fVar10;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar8 < p->nInputs);
  }
  return;
}

Assistant:

void Map_MappingSetPiArrivalTimes( Map_Man_t * p )
{
    Map_Node_t * pNode;
    int i;
    for ( i = 0; i < p->nInputs; i++ )
    {
        pNode = p->pInputs[i];
        // set the arrival time of the positive phase
        if ( Scl_ConIsRunning() )
        {
            float Time = Scl_ConGetInArrFloat( i );
            pNode->tArrival[1].Fall  = Time;
            pNode->tArrival[1].Rise  = Time;
            pNode->tArrival[1].Worst = Time;
        }
        else
            pNode->tArrival[1] = p->pInputArrivals[i];
        pNode->tArrival[1].Rise  += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        pNode->tArrival[1].Fall  += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        pNode->tArrival[1].Worst += p->pNodeDelays ? p->pNodeDelays[pNode->Num] : 0;
        // set the arrival time of the negative phase
        pNode->tArrival[0].Rise  = pNode->tArrival[1].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[0].Fall  = pNode->tArrival[1].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[0].Worst = MAP_MAX(pNode->tArrival[0].Rise, pNode->tArrival[0].Fall);
    }
}